

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateMessageFile
               (FileDescriptor *file,Descriptor *message,Options *options,
               GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  WellKnownType WVar3;
  uint uVar4;
  int iVar5;
  MessageOptions *this;
  undefined4 extraout_var;
  pointer output_00;
  FieldDescriptor *field_00;
  OneofDescriptor *oneof_00;
  string *psVar6;
  Descriptor *pDVar7;
  EnumDescriptor *en;
  Options *options_00;
  int local_250;
  int local_24c;
  int i_5;
  int i_4;
  string local_228;
  OneofDescriptor *local_208;
  OneofDescriptor *oneof_1;
  FieldDescriptor *pFStack_1f8;
  int i_3;
  FieldDescriptor *field_1;
  undefined1 local_1e8 [4];
  int i_2;
  string metadata_fullname;
  string metadata_filename;
  OneofDescriptor *oneof;
  int i_1;
  FieldDescriptor *field;
  undefined1 local_188 [4];
  int i;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_124;
  undefined1 local_120 [4];
  int lastindex;
  string fullname;
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_50;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string filename;
  GeneratorContext *generator_context_local;
  Options *options_local;
  Descriptor *message_local;
  FileDescriptor *file_local;
  
  this = Descriptor::options(message);
  bVar1 = MessageOptions::map_entry(this);
  if (!bVar1) {
    GeneratedClassFileName<google::protobuf::Descriptor>((string *)&output,message,options);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,(string *)&output);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                *)&local_50,(pointer)CONCAT44(extraout_var,iVar2));
    output_00 = std::
                unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                ::get(&local_50);
    io::Printer::Printer((Printer *)((long)&fullname.field_2 + 8),output_00,'^');
    GenerateHead(file,(Printer *)((long)&fullname.field_2 + 8));
    FilenameToClassname((string *)local_120,(string *)&output);
    local_124 = std::__cxx11::string::find_last_of(local_120,0x76cba7);
    if (local_124 != -1) {
      std::__cxx11::string::substr((ulong)&local_148,(ulong)local_120);
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)((long)&fullname.field_2 + 8),"namespace ^name^;\n\n",
                 (char (*) [5])0x77db8d,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    GenerateUseDeclaration(options,(Printer *)((long)&fullname.field_2 + 8));
    GenerateMessageDocComment((Printer *)((long)&fullname.field_2 + 8),message,options);
    if (local_124 != -1) {
      std::__cxx11::string::substr((ulong)((long)&base.field_2 + 8),(ulong)local_120);
      std::__cxx11::string::operator=((string *)local_120,(string *)(base.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)local_188);
    WVar3 = Descriptor::well_known_type(message);
    if (WVar3 == WELLKNOWNTYPE_ANY) {
      std::__cxx11::string::operator=((string *)local_188,"\\Google\\Protobuf\\Internal\\AnyBase");
    }
    else if (WVar3 == WELLKNOWNTYPE_TIMESTAMP) {
      std::__cxx11::string::operator=
                ((string *)local_188,"\\Google\\Protobuf\\Internal\\TimestampBase");
    }
    else {
      std::__cxx11::string::operator=((string *)local_188,"\\Google\\Protobuf\\Internal\\Message");
    }
    io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
              ((Printer *)((long)&fullname.field_2 + 8),"class ^name^ extends ^base^\n{\n",
               (char (*) [5])0x7c6e3d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
               (char (*) [5])0x77db8d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    Indent((Printer *)((long)&fullname.field_2 + 8));
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count(message), field._4_4_ < iVar2;
        field._4_4_ = field._4_4_ + 1) {
      field_00 = Descriptor::field(message,field._4_4_);
      GenerateField(field_00,(Printer *)((long)&fullname.field_2 + 8),options);
    }
    oneof._4_4_ = 0;
    while( true ) {
      uVar4 = Descriptor::real_oneof_decl_count(message);
      options_00 = (Options *)(ulong)uVar4;
      if ((int)uVar4 <= oneof._4_4_) break;
      oneof_00 = Descriptor::oneof_decl(message,oneof._4_4_);
      GenerateOneofField(oneof_00,(Printer *)((long)&fullname.field_2 + 8));
      oneof._4_4_ = oneof._4_4_ + 1;
    }
    io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"\n");
    GenerateMessageConstructorDocComment((Printer *)((long)&fullname.field_2 + 8),message,options);
    io::Printer::Print<>
              ((Printer *)((long)&fullname.field_2 + 8),
               "public function __construct($data = NULL) {\n");
    Indent((Printer *)((long)&fullname.field_2 + 8));
    (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
              ((string *)((long)&metadata_fullname.field_2 + 8),(_anonymous_namespace_ *)file,
               (FileDescriptor *)options,options_00);
    FilenameToClassname((string *)local_1e8,(string *)((long)&metadata_fullname.field_2 + 8));
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)((long)&fullname.field_2 + 8),"\\^fullname^::initOnce();\n",
               (char (*) [9])"fullname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"parent::__construct($data);\n");
    Outdent((Printer *)((long)&fullname.field_2 + 8));
    io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
    for (field_1._4_4_ = 0; iVar2 = field_1._4_4_, iVar5 = Descriptor::field_count(message),
        iVar2 < iVar5; field_1._4_4_ = field_1._4_4_ + 1) {
      pFStack_1f8 = Descriptor::field(message,field_1._4_4_);
      GenerateFieldAccessor(pFStack_1f8,options,(Printer *)((long)&fullname.field_2 + 8));
    }
    for (oneof_1._4_4_ = 0; iVar2 = oneof_1._4_4_,
        iVar5 = Descriptor::real_oneof_decl_count(message), iVar2 < iVar5;
        oneof_1._4_4_ = oneof_1._4_4_ + 1) {
      local_208 = Descriptor::oneof_decl(message,oneof_1._4_4_);
      psVar6 = OneofDescriptor::name_abi_cxx11_(local_208);
      UnderscoresToCamelCase(&local_228,psVar6,true);
      psVar6 = OneofDescriptor::name_abi_cxx11_(local_208);
      io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
                ((Printer *)((long)&fullname.field_2 + 8),
                 "/**\n * @return string\n */\npublic function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                 ,(char (*) [11])"camel_name",&local_228,(char (*) [5])0x77db8d,psVar6);
      std::__cxx11::string::~string((string *)&local_228);
    }
    Outdent((Printer *)((long)&fullname.field_2 + 8));
    io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
    pDVar7 = Descriptor::containing_type(message);
    if (pDVar7 != (Descriptor *)0x0) {
      io::Printer::Print<>
                ((Printer *)((long)&fullname.field_2 + 8),
                 "// Adding a class alias for backwards compatibility with the previous class name.\n"
                );
      LegacyFullClassName<google::protobuf::Descriptor>((string *)&i_5,message,options);
      io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
                ((Printer *)((long)&fullname.field_2 + 8),
                 "class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (char (*) [4])"old",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
      std::__cxx11::string::~string((string *)&i_5);
      LegacyGenerateClassFile<google::protobuf::Descriptor>(file,message,options,generator_context);
    }
    for (local_24c = 0; iVar2 = Descriptor::nested_type_count(message), local_24c < iVar2;
        local_24c = local_24c + 1) {
      pDVar7 = Descriptor::nested_type(message,local_24c);
      GenerateMessageFile(file,pDVar7,options,generator_context);
    }
    for (local_250 = 0; iVar2 = Descriptor::enum_type_count(message), local_250 < iVar2;
        local_250 = local_250 + 1) {
      en = Descriptor::enum_type(message,local_250);
      GenerateEnumFile(file,en,options,generator_context);
    }
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)(metadata_fullname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)local_120);
    io::Printer::~Printer((Printer *)((long)&fullname.field_2 + 8));
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr(&local_50);
    std::__cxx11::string::~string((string *)&output);
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         const Options& options,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedClassFileName(message, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(options, &printer);

  GenerateMessageDocComment(&printer, message, options);
  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  std::string base;

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      base = "\\Google\\Protobuf\\Internal\\AnyBase";
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      base = "\\Google\\Protobuf\\Internal\\TimestampBase";
      break;
    default:
      base = "\\Google\\Protobuf\\Internal\\Message";
      break;
  }

  printer.Print(
      "class ^name^ extends ^base^\n"
      "{\n",
      "base", base,
      "name", fullname);
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, options);
  }
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  GenerateMessageConstructorDocComment(&printer, message, options);
  printer.Print(
      "public function __construct($data = NULL) {\n");
  Indent(&printer);

  std::string metadata_filename = GeneratedMetadataFileName(file, options);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n",
      "fullname", metadata_fullname);

  printer.Print(
      "parent::__construct($data);\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, options, &printer);
  }
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "/**\n"
      " * @return string\n"
      " */\n"
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (message->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(message, options));
    LegacyGenerateClassFile(file, message, options, generator_context);
  }

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), options,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), options, generator_context);
  }
}